

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

BOOL DBG_FlushInstructionCache(LPCVOID lpBaseAddress,SIZE_T dwSize)

{
  SIZE_T dwSize_local;
  LPCVOID lpBaseAddress_local;
  
  return 1;
}

Assistant:

BOOL
DBG_FlushInstructionCache(
                          IN LPCVOID lpBaseAddress,
                          IN SIZE_T dwSize)
{
#if defined(__linux__) && defined(_ARM_)
    // On Linux/arm (at least on 3.10) we found that there is a problem with __do_cache_op (arch/arm/kernel/traps.c)
    // implementing cacheflush syscall. cacheflush flushes only the first page in range [lpBaseAddress, lpBaseAddress + dwSize)
    // and leaves other pages in undefined state which causes random tests failures (often due to SIGSEGV) with no particular pattern.
    //
    // As a workaround, we call __builtin___clear_cache on each page separately.

    const SIZE_T pageSize = VIRTUAL_PAGE_SIZE;
    INT_PTR begin = (INT_PTR)lpBaseAddress;
    const INT_PTR end = begin + dwSize;

    while (begin < end)
    {
        INT_PTR endOrNextPageBegin = ALIGN_UP(begin + 1, pageSize);
        if (endOrNextPageBegin > end)
            endOrNextPageBegin = end;

        __builtin___clear_cache((char *)begin, (char *)endOrNextPageBegin);
        begin = endOrNextPageBegin;
    }
#else
    __builtin___clear_cache((char *)lpBaseAddress, (char *)((INT_PTR)lpBaseAddress + dwSize));
#endif
    return TRUE;
}